

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ConsumerIPCService::ObserveEvents
          (ConsumerIPCService *this,ObserveEventsRequest *req,DeferredObserveEventsResponse *resp)

{
  bool bVar1;
  RemoteConsumer *this_00;
  vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
  *this_01;
  reference pOVar2;
  pointer pCVar3;
  ObservableEvents_Type *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
  *__range1;
  uint32_t events_mask;
  RemoteConsumer *remote_consumer;
  DeferredObserveEventsResponse *resp_local;
  ObserveEventsRequest *req_local;
  ConsumerIPCService *this_local;
  
  this_00 = GetConsumerForCurrentRequest(this);
  RemoteConsumer::CloseObserveEventsResponseStream(this_00);
  ipc::Deferred<perfetto::protos::gen::ObserveEventsResponse>::operator=
            (&this_00->observe_events_response,resp);
  __range1._4_4_ = ObservableEvents_Type_TYPE_UNSPECIFIED;
  this_01 = protos::gen::ObserveEventsRequest::events_to_observe(req);
  __end1 = std::
           vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
           ::begin(this_01);
  type = (ObservableEvents_Type *)
         std::
         vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
         ::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_perfetto::protos::gen::ObservableEvents_Type_*,_std::vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>_>
                                *)&type);
    if (!bVar1) break;
    pOVar2 = __gnu_cxx::
             __normal_iterator<const_perfetto::protos::gen::ObservableEvents_Type_*,_std::vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>_>
             ::operator*(&__end1);
    __range1._4_4_ = *pOVar2 | __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::ObservableEvents_Type_*,_std::vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>_>
    ::operator++(&__end1);
  }
  pCVar3 = std::
           unique_ptr<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ::operator->(&this_00->service_endpoint);
  (*pCVar3->_vptr_ConsumerEndpoint[0xc])(pCVar3,(ulong)__range1._4_4_);
  if (__range1._4_4_ == ObservableEvents_Type_TYPE_UNSPECIFIED) {
    RemoteConsumer::CloseObserveEventsResponseStream(this_00);
  }
  return;
}

Assistant:

void ConsumerIPCService::ObserveEvents(
    const protos::gen::ObserveEventsRequest& req,
    DeferredObserveEventsResponse resp) {
  RemoteConsumer* remote_consumer = GetConsumerForCurrentRequest();

  // If there's a prior stream, close it so that client can clean it up.
  remote_consumer->CloseObserveEventsResponseStream();

  remote_consumer->observe_events_response = std::move(resp);

  uint32_t events_mask = 0;
  for (const auto& type : req.events_to_observe()) {
    events_mask |= static_cast<uint32_t>(type);
  }
  remote_consumer->service_endpoint->ObserveEvents(events_mask);

  // If no events are to be observed, close the stream immediately so that the
  // client can clean up.
  if (events_mask == 0)
    remote_consumer->CloseObserveEventsResponseStream();
}